

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# room-words.h
# Opt level: O0

shared_ptr<RoomBase> RoomWords::getBash(Parameters *parameters)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  element_type *in_RDI;
  TTimestamp TVar2;
  double dVar3;
  shared_ptr<RoomBase> sVar4;
  shared_ptr<RoomWords> result;
  string *in_stack_000001a8;
  Dictionary *in_stack_ffffffffffffff48;
  Dictionary *in_stack_ffffffffffffff50;
  shared_ptr<RoomBase> *this;
  char *in_stack_ffffffffffffff70;
  string local_68 [104];
  
  std::make_shared<RoomWords>();
  peVar1 = std::__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1146c5);
  (peVar1->super_RoomBase).mode = Standard;
  peVar1 = std::__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1146d6);
  std::__cxx11::string::operator=((string *)&(peVar1->super_RoomBase).name,"Bash");
  std::operator+(in_RSI,in_stack_ffffffffffffff70);
  Dictionary::load(in_stack_000001a8);
  std::__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x114726);
  Dictionary::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  Dictionary::~Dictionary((Dictionary *)0x114749);
  std::__cxx11::string::~string(local_68);
  peVar1 = std::__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x11475d);
  (peVar1->super_RoomBase).poolSize = 0x20;
  TVar2 = anon_unknown.dwarf_1322b::timestamp_s();
  peVar1 = std::__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x11477e);
  (peVar1->super_RoomBase).tCreated_s = TVar2;
  peVar1 = std::__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x114796);
  (peVar1->super_RoomBase).tRoundLength_s = 60.0;
  peVar1 = std::__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1147b0);
  this = (shared_ptr<RoomBase> *)(peVar1->super_RoomBase).tCreated_s;
  peVar1 = std::__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1147c8);
  dVar3 = (double)this - (peVar1->super_RoomBase).tRoundLength_s;
  peVar1 = std::__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomWords,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1147e6);
  (peVar1->super_RoomBase).tRoundStart_s = dVar3;
  std::shared_ptr<RoomBase>::shared_ptr<RoomWords,void>
            (this,(shared_ptr<RoomWords> *)in_stack_ffffffffffffff48);
  std::shared_ptr<RoomWords>::~shared_ptr((shared_ptr<RoomWords> *)0x114810);
  sVar4.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<RoomBase>)sVar4.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<RoomBase> getBash(Parameters parameters) {
        auto result = std::make_shared<RoomWords>();

        result->mode = Standard;
        result->name = "Bash";
        result->dictionary = Dictionary::load(parameters.pathData + "words_bash.txt");
        result->poolSize = 32;
        result->tCreated_s = timestamp_s();
        result->tRoundLength_s = 1.0f*60.f;
        result->tRoundStart_s = result->tCreated_s - result->tRoundLength_s;

        return result;
    }